

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O1

int __thiscall cmCTestSubmitHandler::ProcessHandler(cmCTestSubmitHandler *this)

{
  size_type *psVar1;
  pointer pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  cmCTest *pcVar6;
  bool bVar7;
  int iVar8;
  cmValue file_00;
  cmValue typeString;
  char *pcVar9;
  size_t sVar10;
  ostream *poVar11;
  undefined8 *puVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  undefined1 *puVar14;
  undefined8 uVar15;
  pointer pbVar16;
  string *gfile;
  string *psVar17;
  string *file;
  Part p;
  long lVar18;
  char *pcVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string url;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostringstream cmCTestLog_msg_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gfiles;
  string prefix;
  cmGeneratedFileStream ofs;
  string local_4c8;
  string local_4a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  undefined1 local_470 [112];
  ios_base local_400 [264];
  undefined1 local_2f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  string local_2b8;
  undefined1 local_298 [32];
  byte abStack_278 [80];
  ios_base local_228 [504];
  
  pcVar5 = local_298 + 0x10;
  local_298._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CDashUploadFile","");
  file_00 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_298)
  ;
  if ((pointer)local_298._0_8_ != pcVar5) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  local_298._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CDashUploadType","");
  typeString = cmCTestGenericHandler::GetOption
                         (&this->super_cmCTestGenericHandler,(string *)local_298);
  if ((pointer)local_298._0_8_ != pcVar5) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  if (typeString.Value != (string *)0x0 && file_00.Value != (string *)0x0) {
    iVar8 = HandleCDashUploadFile(this,file_00.Value,typeString.Value);
    return iVar8;
  }
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  local_298._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"BuildDirectory","");
  cmCTest::GetCTestConfiguration((string *)&local_2d8,pcVar6,(string *)local_298);
  if ((pointer)local_298._0_8_ != pcVar5) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  if (local_2d8._8_8_ == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"Cannot find BuildDirectory  key in the DartConfiguration.tcl",
               0x3c);
    std::ios::widen((char)(ostream *)local_298 + (char)*(undefined8 *)(local_298._0_8_ + -0x18));
    std::ostream::put((char)local_298);
    std::ostream::flush();
    pcVar6 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar6,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x2d9,(char *)local_470._0_8_,false);
    if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
      operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
    std::ios_base::~ios_base(local_228);
    iVar8 = -1;
    goto LAB_001c82a2;
  }
  pcVar9 = getenv("HTTP_PROXY");
  if (pcVar9 != (char *)0x0) {
    this->HTTPProxyType = 1;
    psVar17 = &this->HTTPProxy;
    pcVar19 = (char *)(this->HTTPProxy)._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)psVar17,0,pcVar19,(ulong)pcVar9);
    pcVar9 = getenv("HTTP_PROXY_PORT");
    if (pcVar9 != (char *)0x0) {
      std::__cxx11::string::append((char *)psVar17);
      getenv("HTTP_PROXY_PORT");
      std::__cxx11::string::append((char *)psVar17);
    }
    pcVar9 = getenv("HTTP_PROXY_TYPE");
    if (pcVar9 != (char *)0x0) {
      local_298._0_8_ = pcVar5;
      sVar10 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,pcVar9,pcVar9 + sVar10);
      iVar8 = std::__cxx11::string::compare(local_298);
      if (iVar8 == 0) {
        iVar8 = 1;
LAB_001c70c8:
        this->HTTPProxyType = iVar8;
      }
      else {
        iVar8 = std::__cxx11::string::compare(local_298);
        if (iVar8 == 0) {
          iVar8 = 2;
          goto LAB_001c70c8;
        }
        iVar8 = std::__cxx11::string::compare(local_298);
        if (iVar8 == 0) {
          iVar8 = 3;
          goto LAB_001c70c8;
        }
      }
      if ((pointer)local_298._0_8_ != pcVar5) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
    }
    pcVar9 = getenv("HTTP_PROXY_USER");
    if (pcVar9 != (char *)0x0) {
      pcVar19 = (char *)(this->HTTPProxyAuth)._M_string_length;
      strlen(pcVar9);
      std::__cxx11::string::_M_replace((ulong)&this->HTTPProxyAuth,0,pcVar19,(ulong)pcVar9);
    }
    pcVar9 = getenv("HTTP_PROXY_PASSWD");
    if (pcVar9 != (char *)0x0) {
      std::__cxx11::string::append((char *)&this->HTTPProxyAuth);
      getenv("HTTP_PROXY_PASSWD");
      std::__cxx11::string::append((char *)&this->HTTPProxyAuth);
    }
  }
  if ((this->HTTPProxy)._M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"   Use HTTP Proxy: ",0x13);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,(this->HTTPProxy)._M_dataplus._M_p,
                         (this->HTTPProxy)._M_string_length);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    pcVar6 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar6,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x2fb,(char *)local_470._0_8_,(this->super_cmCTestGenericHandler).Quiet);
    if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
      operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
    std::ios_base::~ios_base(local_228);
  }
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
  cmCTestGenericHandler::StartLogFile
            (&this->super_cmCTestGenericHandler,"Submit",(cmGeneratedFileStream *)local_298);
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetSubmitResultsPrefix_abi_cxx11_(&local_2b8,this);
  if ((this->Files)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_488,
               local_488.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               &(this->Files)._M_t._M_impl.super__Rb_tree_header);
  }
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  local_470._0_8_ = local_470 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"Update.xml","");
  cmCTest::AddIfExists(pcVar6,PartUpdate,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
  }
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  local_470._0_8_ = local_470 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"Configure.xml","");
  cmCTest::AddIfExists(pcVar6,PartConfigure,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
  }
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  local_470._0_8_ = local_470 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"Build.xml","");
  cmCTest::AddIfExists(pcVar6,PartBuild,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
  }
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  local_470._0_8_ = local_470 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"Test.xml","");
  cmCTest::AddIfExists(pcVar6,PartTest,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
  }
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  local_470._0_8_ = local_470 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"Coverage.xml","");
  bVar7 = cmCTest::AddIfExists(pcVar6,PartCoverage,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
  }
  if (bVar7) {
    local_2f8._0_8_ = (string *)0x0;
    local_2f8._8_8_ = (string *)0x0;
    local_2f8._16_8_ = (pointer)0x0;
    local_470._0_8_ = local_470 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_470,local_2d8._M_allocated_capacity,
               local_2d8._8_8_ + local_2d8._M_allocated_capacity);
    std::__cxx11::string::append(local_470);
    cmCTest::GetCurrentTag_abi_cxx11_(&local_4c8,(this->super_cmCTestGenericHandler).CTest);
    puVar14 = (undefined1 *)0xf;
    if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
      puVar14 = (undefined1 *)local_470._16_8_;
    }
    if (puVar14 < (undefined1 *)(local_4c8._M_string_length + local_470._8_8_)) {
      uVar15 = (undefined1 *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        uVar15 = local_4c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (undefined1 *)(local_4c8._M_string_length + local_470._8_8_))
      goto LAB_001c7506;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_4c8,0,(char *)0x0,local_470._0_8_);
    }
    else {
LAB_001c7506:
      puVar12 = (undefined8 *)
                std::__cxx11::string::_M_append(local_470,(ulong)local_4c8._M_dataplus._M_p);
    }
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    psVar1 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_4a8.field_2._M_allocated_capacity = *psVar1;
      local_4a8.field_2._8_8_ = puVar12[3];
    }
    else {
      local_4a8.field_2._M_allocated_capacity = *psVar1;
      local_4a8._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_4a8._M_string_length = puVar12[1];
    *puVar12 = psVar1;
    puVar12[1] = 0;
    *(undefined1 *)psVar1 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,
                      (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
      operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
    }
    local_470._0_8_ = local_470 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_470,local_4a8._M_dataplus._M_p,
               local_4a8._M_dataplus._M_p + local_4a8._M_string_length);
    std::__cxx11::string::append(local_470);
    std::__cxx11::string::operator=((string *)&local_4a8,(string *)local_470);
    if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
      operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,"Globbing for: ",0xe);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_470,local_4a8._M_dataplus._M_p,local_4a8._M_string_length)
    ;
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    pcVar6 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar6,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x319,local_4c8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,
                      (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
    std::ios_base::~ios_base(local_400);
    bVar7 = cmSystemTools::SimpleGlob
                      (&local_4a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2f8,1);
    uVar15 = local_2f8._8_8_;
    if (bVar7) {
      if (local_2f8._0_8_ != local_2f8._8_8_) {
        psVar17 = (string *)local_2f8._0_8_;
        do {
          std::__cxx11::string::substr((ulong)local_470,(ulong)psVar17);
          std::__cxx11::string::operator=((string *)psVar17,(string *)local_470);
          if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
            operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,"Glob file: ",0xb)
          ;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_470,(psVar17->_M_dataplus)._M_p,
                               psVar17->_M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar6 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar6,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x31e,local_4c8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
            operator_delete(local_4c8._M_dataplus._M_p,
                            (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
          std::ios_base::~ios_base(local_400);
          cmCTest::AddSubmitFile((this->super_cmCTestGenericHandler).CTest,PartCoverage,psVar17);
          psVar17 = psVar17 + 1;
        } while (psVar17 != (string *)uVar15);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_470,"Problem globbing",0x10);
      std::ios::widen((char)(ostream *)local_470 + (char)*(undefined8 *)(local_470._0_8_ + -0x18));
      std::ostream::put((char)local_470);
      std::ostream::flush();
      pcVar6 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar6,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x322,local_4c8._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,
                        (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
      std::ios_base::~ios_base(local_400);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2f8);
  }
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  local_470._0_8_ = local_470 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"DynamicAnalysis.xml","");
  cmCTest::AddIfExists(pcVar6,PartMemCheck,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
  }
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  local_470._0_8_ = local_470 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"DynamicAnalysis-Test.xml","")
  ;
  cmCTest::AddIfExists(pcVar6,PartMemCheck,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
  }
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  local_470._0_8_ = local_470 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"Purify.xml","");
  cmCTest::AddIfExists(pcVar6,PartMemCheck,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
  }
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  local_470._0_8_ = local_470 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"Notes.xml","");
  cmCTest::AddIfExists(pcVar6,PartNotes,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
  }
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  local_470._0_8_ = local_470 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"Upload.xml","");
  cmCTest::AddIfExists(pcVar6,PartUpload,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
  }
  lVar18 = 0;
  do {
    if (this->SubmitPart[lVar18] == true) {
      pvVar13 = cmCTest::GetSubmitFiles_abi_cxx11_
                          ((this->super_cmCTestGenericHandler).CTest,(Part)lVar18);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_488,
                 local_488.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (pvVar13->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (pvVar13->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0xc);
  __first = cmRemoveDuplicates<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )local_488.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )local_488.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_488,(iterator)__first._M_current,
             (iterator)
             local_488.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (this->SubmitPart[0xb] == true) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_488,
               (char (*) [9])"Done.xml");
  }
  if ((abStack_278[*(long *)(local_298._0_8_ + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"Upload files:",0xd);
    std::ios::widen((char)(ostream *)local_298 + (char)*(undefined8 *)(local_298._0_8_ + -0x18));
    std::ostream::put((char)local_298);
    std::ostream::flush();
    pbVar2 = local_488.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_488.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_488.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar8 = 0;
      pbVar16 = local_488.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        poVar11 = (ostream *)std::ostream::operator<<(local_298,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(pbVar16->_M_dataplus)._M_p,pbVar16->_M_string_length);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        iVar8 = iVar8 + 1;
        pbVar16 = pbVar16 + 1;
      } while (pbVar16 != pbVar2);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,"Submit files\n",0xd);
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar6,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
               ,0x34e,local_4a8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  paVar3 = &local_4a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
  std::ios_base::~ios_base(local_400);
  pcVar9 = cmCTest::GetSpecificGroup((this->super_cmCTestGenericHandler).CTest);
  if (pcVar9 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_470,"   Send to group: ",0x12);
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,pcVar9,sVar10);
    std::ios::widen((char)(ostream *)local_470 + (char)*(undefined8 *)(local_470._0_8_ + -0x18));
    std::ostream::put((char)local_470);
    std::ostream::flush();
    pcVar6 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar6,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x353,local_4a8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
    std::ios_base::~ios_base(local_400);
  }
  this->LogFile = (ostream *)local_298;
  cmCTest::GetSubmitURL_abi_cxx11_(&local_4a8,(this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,"   SubmitURL: ",0xe);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_470,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
  local_4c8._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_4c8,1);
  pcVar6 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar6,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
               ,0x359,local_4c8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  paVar4 = &local_4c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c8._M_dataplus._M_p,(ulong)(local_4c8.field_2._M_allocated_capacity + 1))
    ;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
  std::ios_base::~ios_base(local_400);
  local_4c8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c8,local_2d8._M_allocated_capacity,
             local_2d8._8_8_ + local_2d8._M_allocated_capacity);
  std::__cxx11::string::append((char *)&local_4c8);
  cmCTest::GetCurrentTag_abi_cxx11_((string *)local_2f8,(this->super_cmCTestGenericHandler).CTest);
  pbVar2 = (pointer)((long)&((_Alloc_hider *)local_2f8._8_8_)->_M_p + local_4c8._M_string_length);
  uVar15 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != paVar4) {
    uVar15 = local_4c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < pbVar2) {
    pbVar16 = (pointer)0xf;
    if ((string *)local_2f8._0_8_ != (string *)(local_2f8 + 0x10)) {
      pbVar16 = (pointer)local_2f8._16_8_;
    }
    if (pbVar16 < pbVar2) goto LAB_001c7ec4;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)local_2f8,0,(char *)0x0,(ulong)local_4c8._M_dataplus._M_p);
  }
  else {
LAB_001c7ec4:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4c8,local_2f8._0_8_);
  }
  local_470._0_8_ = local_470 + 0x10;
  pcVar9 = (char *)(puVar12 + 2);
  if ((char *)*puVar12 == pcVar9) {
    local_470._16_8_ = *(undefined8 *)pcVar9;
    local_470._24_8_ = puVar12[3];
  }
  else {
    local_470._16_8_ = *(undefined8 *)pcVar9;
    local_470._0_8_ = (char *)*puVar12;
  }
  local_470._8_8_ = puVar12[1];
  *puVar12 = pcVar9;
  puVar12[1] = 0;
  *pcVar9 = '\0';
  bVar7 = SubmitUsingHTTP(this,(string *)local_470,&local_488,&local_2b8,&local_4a8);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,(ulong)(local_470._16_8_ + 1));
  }
  if ((string *)local_2f8._0_8_ != (string *)(local_2f8 + 0x10)) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != paVar4) {
    operator_delete(local_4c8._M_dataplus._M_p,(ulong)(local_4c8.field_2._M_allocated_capacity + 1))
    ;
  }
  if (bVar7) {
    if (this->HasErrors == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_470,"   Errors occurred during submission.\n",0x26);
      pcVar6 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar6,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x364,local_4c8._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != paVar4) {
        operator_delete(local_4c8._M_dataplus._M_p,
                        (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
      std::ios_base::~ios_base(local_400);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"   Errors occurred during submission.\n",0x26);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_470,"   Submission successful",0x18);
      pcVar19 = "";
      pcVar9 = "";
      if (this->HasWarnings != false) {
        pcVar9 = ", with warnings.";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_470,pcVar9,(ulong)this->HasWarnings << 4);
      std::ios::widen((char)(ostream *)local_470 + (char)*(undefined8 *)(local_470._0_8_ + -0x18));
      std::ostream::put((char)local_470);
      std::ostream::flush();
      pcVar6 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar6,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x36b,local_4c8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != paVar4) {
        operator_delete(local_4c8._M_dataplus._M_p,
                        (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
      std::ios_base::~ios_base(local_400);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"   Submission successful",0x18);
      if (this->HasWarnings != false) {
        pcVar19 = ", with warnings.";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,pcVar19,(ulong)this->HasWarnings << 4);
      std::ios::widen((char)(ostream *)local_298 + (char)*(undefined8 *)(local_298._0_8_ + -0x18));
      std::ostream::put((char)local_298);
      std::ostream::flush();
    }
    iVar8 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_470,"   Problems when submitting via HTTP\n",0x25);
    pcVar6 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar6,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x35e,local_4c8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != paVar4) {
      operator_delete(local_4c8._M_dataplus._M_p,
                      (ulong)(local_4c8.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
    std::ios_base::~ios_base(local_400);
    iVar8 = -1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"   Problems when submitting via HTTP\n",0x25);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_488);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
LAB_001c82a2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_allocated_capacity != &local_2c8) {
    operator_delete((void *)local_2d8._M_allocated_capacity,local_2c8._M_allocated_capacity + 1);
  }
  return iVar8;
}

Assistant:

int cmCTestSubmitHandler::ProcessHandler()
{
  cmValue cdashUploadFile = this->GetOption("CDashUploadFile");
  cmValue cdashUploadType = this->GetOption("CDashUploadType");
  if (cdashUploadFile && cdashUploadType) {
    return this->HandleCDashUploadFile(cdashUploadFile, cdashUploadType);
  }

  const std::string& buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  if (char const* proxy = getenv("HTTP_PROXY")) {
    this->HTTPProxyType = 1;
    this->HTTPProxy = proxy;
    if (getenv("HTTP_PROXY_PORT")) {
      this->HTTPProxy += ":";
      this->HTTPProxy += getenv("HTTP_PROXY_PORT");
    }
    if (char const* proxy_type = getenv("HTTP_PROXY_TYPE")) {
      std::string type = proxy_type;
      // HTTP/SOCKS4/SOCKS5
      if (type == "HTTP") {
        this->HTTPProxyType = 1;
      } else if (type == "SOCKS4") {
        this->HTTPProxyType = 2;
      } else if (type == "SOCKS5") {
        this->HTTPProxyType = 3;
      }
    }
    if (getenv("HTTP_PROXY_USER")) {
      this->HTTPProxyAuth = getenv("HTTP_PROXY_USER");
    }
    if (getenv("HTTP_PROXY_PASSWD")) {
      this->HTTPProxyAuth += ":";
      this->HTTPProxyAuth += getenv("HTTP_PROXY_PASSWD");
    }
  }

  if (!this->HTTPProxy.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Use HTTP Proxy: " << this->HTTPProxy << std::endl,
                       this->Quiet);
  }
  cmGeneratedFileStream ofs;
  this->StartLogFile("Submit", ofs);

  std::vector<std::string> files;
  std::string prefix = this->GetSubmitResultsPrefix();

  if (!this->Files.empty()) {
    // Submit the explicitly selected files:
    cm::append(files, this->Files);
  }

  // Add to the list of files to submit from any selected, existing parts:
  //

  // TODO:
  // Check if test is enabled

  this->CTest->AddIfExists(cmCTest::PartUpdate, "Update.xml");
  this->CTest->AddIfExists(cmCTest::PartConfigure, "Configure.xml");
  this->CTest->AddIfExists(cmCTest::PartBuild, "Build.xml");
  this->CTest->AddIfExists(cmCTest::PartTest, "Test.xml");
  if (this->CTest->AddIfExists(cmCTest::PartCoverage, "Coverage.xml")) {
    std::vector<std::string> gfiles;
    std::string gpath =
      buildDirectory + "/Testing/" + this->CTest->GetCurrentTag();
    std::string::size_type glen = gpath.size() + 1;
    gpath = gpath + "/CoverageLog*";
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Globbing for: " << gpath << std::endl, this->Quiet);
    if (cmSystemTools::SimpleGlob(gpath, gfiles, 1)) {
      for (std::string& gfile : gfiles) {
        gfile = gfile.substr(glen);
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "Glob file: " << gfile << std::endl, this->Quiet);
        this->CTest->AddSubmitFile(cmCTest::PartCoverage, gfile);
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Problem globbing" << std::endl);
    }
  }
  this->CTest->AddIfExists(cmCTest::PartMemCheck, "DynamicAnalysis.xml");
  this->CTest->AddIfExists(cmCTest::PartMemCheck, "DynamicAnalysis-Test.xml");
  this->CTest->AddIfExists(cmCTest::PartMemCheck, "Purify.xml");
  this->CTest->AddIfExists(cmCTest::PartNotes, "Notes.xml");
  this->CTest->AddIfExists(cmCTest::PartUpload, "Upload.xml");

  // Query parts for files to submit.
  for (cmCTest::Part p = cmCTest::PartStart; p != cmCTest::PartCount;
       p = static_cast<cmCTest::Part>(p + 1)) {
    // Skip parts we are not submitting.
    if (!this->SubmitPart[p]) {
      continue;
    }

    // Submit files from this part.
    cm::append(files, this->CTest->GetSubmitFiles(p));
  }

  // Make sure files are unique, but preserve order.
  {
    // This endPos intermediate is needed to work around non-conformant C++11
    // standard libraries that have erase(iterator,iterator) instead of
    // erase(const_iterator,const_iterator).
    size_t endPos = cmRemoveDuplicates(files) - files.cbegin();
    files.erase(files.begin() + endPos, files.end());
  }

  // Submit Done.xml last
  if (this->SubmitPart[cmCTest::PartDone]) {
    files.emplace_back("Done.xml");
  }

  if (ofs) {
    ofs << "Upload files:" << std::endl;
    int cnt = 0;
    for (std::string const& file : files) {
      ofs << cnt << "\t" << file << std::endl;
      cnt++;
    }
  }
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Submit files\n",
                     this->Quiet);
  const char* specificGroup = this->CTest->GetSpecificGroup();
  if (specificGroup) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Send to group: " << specificGroup << std::endl,
                       this->Quiet);
  }
  this->SetLogFile(&ofs);

  std::string url = this->CTest->GetSubmitURL();
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   SubmitURL: " << url << '\n', this->Quiet);
  if (!this->SubmitUsingHTTP(buildDirectory + "/Testing/" +
                               this->CTest->GetCurrentTag(),
                             files, prefix, url)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "   Problems when submitting via HTTP\n");
    ofs << "   Problems when submitting via HTTP\n";
    return -1;
  }
  if (this->HasErrors) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Errors occurred during submission.\n");
    ofs << "   Errors occurred during submission.\n";
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Submission successful"
                         << (this->HasWarnings ? ", with warnings." : "")
                         << std::endl,
                       this->Quiet);
    ofs << "   Submission successful"
        << (this->HasWarnings ? ", with warnings." : "") << std::endl;
  }

  return 0;
}